

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevI::BandStopBase::setup
          (BandStopBase *this,int order,double centerFrequency,double widthFrequency,double rippleDb
          )

{
  Cascade *in_XMM1_Qa;
  LayoutBase *in_XMM2_Qa;
  double in_stack_00000030;
  int in_stack_0000003c;
  LayoutBase *in_stack_000000a0;
  LayoutBase *in_stack_000000a8;
  double in_stack_000000b0;
  double in_stack_000000b8;
  BandStopTransform *in_stack_000000c0;
  
  AnalogLowPass::design((AnalogLowPass *)rippleDb,in_stack_0000003c,in_stack_00000030);
  BandStopTransform::BandStopTransform
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a0);
  Cascade::setLayout(in_XMM1_Qa,in_XMM2_Qa);
  return;
}

Assistant:

void BandStopBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency,
                          double rippleDb)
{
  m_analogProto.design (order, rippleDb);

  BandStopTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}